

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::MultiplyDenseValues(Codec *this)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *in_RDI;
  uint16_t dest_column_i_2;
  uint bit1_1;
  uint bit0_1;
  uint ii_2;
  uint second_loop_count;
  uint16_t dest_column_i_1;
  uint bit1;
  uint bit0;
  uint ii_1;
  uint loop_count;
  uint16_t dest_column_i;
  uint8_t *src;
  uint bit_i;
  uint ii;
  uint8_t *combo;
  uint16_t *row;
  uint16_t *clr_bits;
  uint16_t *set_bits;
  uint16_t set_count;
  uint max_x;
  uint16_t column_i;
  uint16_t block_count;
  uint16_t bits [500];
  uint16_t rows [500];
  PeelColumn *column;
  uint8_t *source_block;
  uint8_t *temp_block;
  uint16_t dense_count;
  PCGRandom prng;
  uint local_878;
  uint local_864;
  uint local_84c;
  void *local_848;
  ushort *local_840;
  uint local_820;
  ushort local_81c;
  uint16_t local_818 [18];
  int in_stack_fffffffffffff80c;
  void *in_stack_fffffffffffff810;
  void *in_stack_fffffffffffff818;
  void *in_stack_fffffffffffff820;
  int in_stack_fffffffffffff894;
  void *in_stack_fffffffffffff898;
  void *in_stack_fffffffffffff8a0;
  void *in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff97c;
  void *in_stack_fffffffffffff980;
  void *in_stack_fffffffffffff988;
  ushort local_428;
  ushort local_426 [503];
  long local_38;
  long local_30;
  void *local_28;
  ushort local_1a;
  PCGRandom local_18;
  
  PCGRandom::PCGRandom(&local_18);
  PCGRandom::Seed(&local_18,(ulong)in_RDI[4],0);
  local_1a = *(ushort *)((long)in_RDI + 10);
  local_28 = (void *)(*(long *)(in_RDI + 8) +
                     (ulong)(*in_RDI * ((uint)(ushort)in_RDI[1] + (uint)(ushort)in_RDI[6])));
  local_30 = *(long *)(in_RDI + 8);
  local_38 = *(long *)(in_RDI + 0x1a);
  uVar1 = in_RDI[1];
  for (local_81c = 0; local_81c < (ushort)uVar1; local_81c = local_81c + local_1a) {
    local_820 = (uint)local_1a;
    if ((uint)(ushort)uVar1 < (uint)local_81c + (uint)local_1a) {
      local_820 = (uint)(ushort)in_RDI[1] - (uint)local_81c;
    }
    ShuffleDeck16(&local_18,&local_428,(uint)local_1a);
    ShuffleDeck16(&local_18,local_818,(uint)local_1a);
    uVar3 = (int)(local_1a + 1) >> 1;
    local_848 = (void *)0x0;
    for (local_84c = 0; local_84c < uVar3; local_84c = local_84c + 1) {
      uVar4 = (uint)local_818[local_84c];
      pvVar2 = local_848;
      if (((uVar4 < local_820) && (*(char *)(local_38 + (ulong)uVar4 * 6 + 4) == '\x01')) &&
         (pvVar2 = (void *)(local_30 + (ulong)(*in_RDI * uVar4)), local_848 != (void *)0x0)) {
        if (local_848 == local_28) {
          gf256_add_mem(in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                        in_stack_fffffffffffff97c);
          pvVar2 = local_848;
        }
        else {
          gf256_addset_mem(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                           in_stack_fffffffffffff898,in_stack_fffffffffffff894);
          local_848 = local_28;
          pvVar2 = local_848;
        }
      }
      local_848 = pvVar2;
    }
    if (local_848 == (void *)0x0) {
      memset(local_28,0,(ulong)*in_RDI);
    }
    else {
      if (local_848 != local_28) {
        memcpy(local_28,local_848,(ulong)*in_RDI);
      }
      if (*(short *)(*(long *)(in_RDI + 0x34) + (ulong)local_428 * 2) != -1) {
        gf256_add_mem(in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff97c)
        ;
      }
    }
    ShuffleDeck16(&local_18,local_818,(uint)local_1a);
    uVar4 = (uint)local_1a;
    local_840 = local_426;
    for (local_864 = 0; local_864 < (uint)((int)uVar4 >> 1); local_864 = local_864 + 1) {
      uVar5 = (uint)local_818[(long)(int)uVar3 + (ulong)local_864];
      if ((local_818[local_864] < local_820) &&
         (*(char *)(local_38 + (ulong)(uint)local_818[local_864] * 6 + 4) == '\x01')) {
        if ((uVar5 < local_820) && (*(char *)(local_38 + (ulong)uVar5 * 6 + 4) == '\x01')) {
          gf256_add2_mem(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                         in_stack_fffffffffffff810,in_stack_fffffffffffff80c);
        }
        else {
          gf256_add_mem(in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                        in_stack_fffffffffffff97c);
        }
      }
      else if ((uVar5 < local_820) && (*(char *)(local_38 + (ulong)uVar5 * 6 + 4) == '\x01')) {
        gf256_add_mem(in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff97c)
        ;
      }
      if (*(short *)(*(long *)(in_RDI + 0x34) + (ulong)*local_840 * 2) != -1) {
        gf256_add_mem(in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff97c)
        ;
      }
      local_840 = local_840 + 1;
    }
    ShuffleDeck16(&local_18,local_818,(uint)local_1a);
    uVar5 = (uint)local_1a;
    for (local_878 = 0; local_878 < (((int)uVar4 >> 1) - 1U) + (uVar5 & 1);
        local_878 = local_878 + 1) {
      uVar6 = (uint)local_818[(long)(int)uVar3 + (ulong)local_878];
      if ((local_818[local_878] < local_820) &&
         (*(char *)(local_38 + (ulong)(uint)local_818[local_878] * 6 + 4) == '\x01')) {
        if ((uVar6 < local_820) && (*(char *)(local_38 + (ulong)uVar6 * 6 + 4) == '\x01')) {
          gf256_add2_mem(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                         in_stack_fffffffffffff810,in_stack_fffffffffffff80c);
        }
        else {
          gf256_add_mem(in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                        in_stack_fffffffffffff97c);
        }
      }
      else if ((uVar6 < local_820) && (*(char *)(local_38 + (ulong)uVar6 * 6 + 4) == '\x01')) {
        gf256_add_mem(in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff97c)
        ;
      }
      if (*(short *)(*(long *)(in_RDI + 0x34) + (ulong)*local_840 * 2) != -1) {
        gf256_add_mem(in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff97c)
        ;
      }
      local_840 = local_840 + 1;
    }
    local_38 = local_38 + (long)(int)(uint)local_1a * 6;
    local_30 = local_30 + (ulong)(*in_RDI * (uint)local_1a);
  }
  return;
}

Assistant:

void Codec::MultiplyDenseValues()
{
    CAT_IF_DUMP(cout << endl << "---- MultiplyDenseValues ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0;)

    // Initialize PRNG
    PCGRandom prng;
    prng.Seed(_d_seed);

    const uint16_t dense_count = _dense_count;
    CAT_DEBUG_ASSERT((unsigned)(_block_count + _mix_count) < _recovery_rows);
    uint8_t * GF256_RESTRICT temp_block = _recovery_blocks + _block_bytes * (_block_count + _mix_count);
    const uint8_t * GF256_RESTRICT source_block = _recovery_blocks;
    const PeelColumn * GF256_RESTRICT column = _peel_cols;
    uint16_t rows[CAT_MAX_DENSE_ROWS];
    uint16_t bits[CAT_MAX_DENSE_ROWS];
    const uint16_t block_count = _block_count;

    // For each block of columns:
    for (uint16_t column_i = 0; column_i < block_count; column_i += dense_count,
        column += dense_count, source_block += _block_bytes * dense_count)
    {
        unsigned max_x = dense_count;

        // Handle final columns
        if (column_i + dense_count > block_count) {
            max_x = _block_count - column_i;
        }

        CAT_IF_DUMP(cout << endl << "For window of columns between " << column_i <<
            " and " << column_i + dense_count - 1 << " (inclusive):" << endl;)

        // Shuffle row and bit order
        ShuffleDeck16(prng, rows, dense_count);
        ShuffleDeck16(prng, bits, dense_count);

        // Initialize counters
        const uint16_t set_count = (dense_count + 1) >> 1;
        uint16_t * GF256_RESTRICT set_bits = bits;
        uint16_t * GF256_RESTRICT clr_bits = set_bits + set_count;
        const uint16_t * GF256_RESTRICT row = rows;

        CAT_IF_DUMP(cout << "Generating first row " << _ge_row_map[*row] << ":";)

        // Generate first row
        const uint8_t * GF256_RESTRICT combo = 0;
        CAT_IF_ROWOP(++rowops;)

        for (unsigned ii = 0; ii < set_count; ++ii)
        {
            unsigned bit_i = set_bits[ii];

            // If bit is peeled:
            if (bit_i < max_x && column[bit_i].Mark == MARK_PEEL)
            {
                CAT_IF_DUMP(cout << " " << column_i + bit_i;)

                const uint8_t * GF256_RESTRICT src = source_block + _block_bytes * bit_i;

                // If no combo used yet:
                if (!combo) {
                    combo = src;
                }
                else if (combo == temp_block)
                {
                    // Else if combo has been used: XOR it in
                    gf256_add_mem(temp_block, src, _block_bytes);

                    CAT_IF_ROWOP(++rowops;)
                }
                else
                {
                    // Else if combo needs to be used: Combine into block
                    gf256_addset_mem(temp_block, combo, src, _block_bytes);

                    CAT_IF_ROWOP(++rowops;)

                    combo = temp_block;
                }
            }
        }

        CAT_IF_DUMP(cout << endl;)

        // If no combo ever triggered:
        if (!combo) {
            memset(temp_block, 0, _block_bytes);
        }
        else
        {
            // Else if never combined two: Just copy it
            if (combo != temp_block)
            {
                memcpy(temp_block, combo, _block_bytes);
                CAT_IF_ROWOP(++rowops;)
            }

            const uint16_t dest_column_i = _ge_row_map[*row];

            // Store in destination column in recovery blocks
            if (dest_column_i != LIST_TERM)
            {
                CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);
                gf256_add_mem(_recovery_blocks + _block_bytes * dest_column_i, temp_block, _block_bytes);
                CAT_IF_ROWOP(++rowops;)
            }
        }

        ++row;

        // Reshuffle bit order: Shuffle-2 Code
        ShuffleDeck16(prng, bits, dense_count);

        const unsigned loop_count = (dense_count >> 1);
        CAT_DEBUG_ASSERT(loop_count < CAT_MAX_DENSE_ROWS);

        // Generate first half of rows
        for (unsigned ii = 0; ii < loop_count; ++ii)
        {
            CAT_IF_DUMP(cout << "Flipping bits for derivative row " << _ge_row_map[*row] << ":";)

            CAT_DEBUG_ASSERT(ii < CAT_MAX_DENSE_ROWS);
            const unsigned bit0 = set_bits[ii];
            const unsigned bit1 = clr_bits[ii];

            // Add in peeled columns
            if (bit0 < max_x && column[bit0].Mark == MARK_PEEL)
            {
                if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0 << "+" << column_i + bit1;)

                    gf256_add2_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        source_block + _block_bytes * bit1,
                        _block_bytes);
                }
                else
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0;)

                    gf256_add_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        _block_bytes);
                }
                CAT_IF_ROWOP(++rowops;)
            }
            else if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
            {
                CAT_IF_DUMP(cout << " " << column_i + bit1;)

                gf256_add_mem(
                    temp_block,
                    source_block + _block_bytes * bit1,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }

            CAT_IF_DUMP(cout << endl;)

            const uint16_t dest_column_i = _ge_row_map[*row++];

            // Store in destination column in recovery blocks
            if (dest_column_i != LIST_TERM)
            {
                CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);

                gf256_add_mem(
                    _recovery_blocks + _block_bytes * dest_column_i,
                    temp_block,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }
        }

        // Reshuffle bit order: Shuffle-2 Code
        ShuffleDeck16(prng, bits, dense_count);

        const unsigned second_loop_count = loop_count - 1 + (dense_count & 1);
        CAT_DEBUG_ASSERT(second_loop_count < CAT_MAX_DENSE_ROWS);

        // Generate second half of rows
        for (unsigned ii = 0; ii < second_loop_count; ++ii)
        {
            CAT_IF_DUMP(cout << "Flipping bits for derivative row " << _ge_row_map[*row] << ":";)

            // Add in peeled columns
            CAT_DEBUG_ASSERT(ii < CAT_MAX_DENSE_ROWS);
            const unsigned bit0 = set_bits[ii];
            const unsigned bit1 = clr_bits[ii];

            if (bit0 < max_x && column[bit0].Mark == MARK_PEEL)
            {
                if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0 << "+" << column_i + bit1;)

                    CAT_DEBUG_ASSERT(bit0 < _block_count);
                    CAT_DEBUG_ASSERT(bit1 < _block_count);

                    gf256_add2_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        source_block + _block_bytes * bit1,
                        _block_bytes);
                }
                else
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0;)

                    CAT_DEBUG_ASSERT(bit0 < _block_count);

                    gf256_add_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        _block_bytes);
                }

                CAT_IF_ROWOP(++rowops;)
            }
            else if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
            {
                CAT_IF_DUMP(cout << " " << column_i + bit1;)

                CAT_DEBUG_ASSERT(bit1 < _block_count);

                gf256_add_mem(
                    temp_block,
                    source_block + _block_bytes * bit1,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }

            CAT_IF_DUMP(cout << endl;)

            // Store in destination column in recovery blocks
            const uint16_t dest_column_i = _ge_row_map[*row++];

            if (dest_column_i != LIST_TERM)
            {
                CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);

                gf256_add_mem(
                    _recovery_blocks + _block_bytes * dest_column_i,
                    temp_block,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }
        }
    } // next column

    CAT_IF_ROWOP(cout << "MultiplyDenseValues used " << rowops << " row ops = " << rowops / (double)_block_count << "*N" << endl;)
}